

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_base.h
# Opt level: O0

void __thiscall tvm::NodeBase::DecRef(NodeBase *this)

{
  int iVar1;
  NodeBase *this_local;
  
  LOCK();
  iVar1 = *(int *)this;
  *(int *)this = *(int *)this + -1;
  UNLOCK();
  if ((iVar1 == 1) && (*(long *)(this + 8) != 0)) {
    (**(code **)(this + 8))(this);
  }
  return;
}

Assistant:

void DecRef() {
    if (ref_counter_.fetch_sub(1, std::memory_order_release) == 1) {
      std::atomic_thread_fence(std::memory_order_acquire);
      if (this->deleter_ != nullptr) {
        (*this->deleter_)(this);
      }
    }
  }